

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printNodes(PrinterStream *this)

{
  pointer ppVar1;
  ProcessorInstance *pPVar2;
  CodePrinter *pCVar3;
  pointer ppVar4;
  string local_50;
  
  ppVar1 = (this->module->processorInstances).
           super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->module->processorInstances).
                super__Vector_base<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    pPVar2 = ppVar4->object;
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"node ");
    padded(&local_50,&pPVar2->instanceName,0x10);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_50);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3," = ");
    choc::text::CodePrinter::operator<<(pCVar3,&pPVar2->sourceName);
    std::__cxx11::string::~string((string *)&local_50);
    if (1 < pPVar2->arraySize) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out,'[');
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,pPVar2->arraySize);
      choc::text::CodePrinter::operator<<(pCVar3,']');
    }
    if (((pPVar2->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_engaged != false) ||
       (((pPVar2->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_engaged & 1U) != 0)) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out," ");
      ClockMultiplier::toString_abi_cxx11_(&local_50,&pPVar2->clockMultiplier);
      choc::text::CodePrinter::operator<<(pCVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::startNewLine(pCVar3);
  }
  return;
}

Assistant:

void printNodes()
        {
            for (auto mi : module.processorInstances)
            {
                out << "node " << padded (mi->instanceName, 16) << " = " << mi->sourceName;

                if (mi->arraySize > 1)
                    out << '[' << mi->arraySize << ']';

                if (mi->clockMultiplier.hasValue())
                    out << " " << mi->clockMultiplier.toString();

                out << ';' << newLine;
            }
        }